

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

parasail_result_t * parasail_result_new_table1(int a,int b)

{
  parasail_result_t *ppVar1;
  parasail_result_extra_trace_t *ppVar2;
  void *pvVar3;
  size_t __size;
  
  if ((a < 1) || (b < 1)) {
    parasail_result_new_table1_cold_2();
  }
  else {
    ppVar1 = parasail_result_new();
    if (ppVar1 != (parasail_result_t *)0x0) {
      ppVar2 = (parasail_result_extra_trace_t *)malloc(8);
      (ppVar1->field_4).trace = ppVar2;
      if (ppVar2 != (parasail_result_extra_trace_t *)0x0) {
        __size = (ulong)(uint)(b * a) << 2;
        pvVar3 = malloc(__size);
        ppVar2->trace_table = pvVar3;
        if (pvVar3 != (void *)0x0) {
          return ppVar1;
        }
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table1",__size);
        return (parasail_result_t *)0x0;
      }
      parasail_result_new_table1_cold_1();
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* parasail_result_new_table1(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    /* validate inputs */
    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    /* allocate only score table */
    PARASAIL_NEW(result->tables, parasail_result_extra_tables_t);
    PARASAIL_CALLOC(result->tables->score_table, int, a*b);

    return result;
}